

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O1

MDDEntry * __thiscall ASDCP::Dictionary::FindULAnyVersion(Dictionary *this,byte_t *ul_buf)

{
  _Rb_tree_header *__y;
  _Rb_tree_node_base *this_00;
  undefined8 uVar1;
  bool bVar2;
  const_iterator cVar3;
  ILogSink *this_01;
  char *pcVar4;
  MDDEntry *pMVar5;
  byte_t search_ul [16];
  UL target;
  char buf [64];
  byte_t local_a8 [4];
  byte_t abStack_a4 [2];
  byte_t bStack_a2;
  UL local_98;
  UL local_78 [2];
  
  if (*this->m_MDD_Table[0].name == '\0') {
    __assert_fail("m_MDD_Table[0].name[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                  ,0x130,
                  "const ASDCP::MDDEntry *ASDCP::Dictionary::FindULAnyVersion(const byte_t *) const"
                 );
  }
  uVar1 = *(undefined8 *)ul_buf;
  local_a8 = SUB84(uVar1,0);
  abStack_a4 = SUB82((ulong)uVar1 >> 0x20,0);
  bStack_a2 = (byte_t)((ulong)uVar1 >> 0x30);
  local_98.super_Identifier<16U>.m_HasValue = true;
  local_98.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)ul_buf;
  local_98.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(ul_buf + 8);
  local_98.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021f038;
  local_78[0].super_Identifier<16U>.m_HasValue = true;
  local_78[0].super_Identifier<16U>.m_Value[0] = local_a8[0];
  local_78[0].super_Identifier<16U>.m_Value[1] = local_a8[1];
  local_78[0].super_Identifier<16U>.m_Value[2] = local_a8[2];
  local_78[0].super_Identifier<16U>.m_Value[3] = local_a8[3];
  local_78[0].super_Identifier<16U>.m_Value[4] = abStack_a4[0];
  local_78[0].super_Identifier<16U>.m_Value[5] = abStack_a4[1];
  local_78[0].super_Identifier<16U>.m_Value[6] = bStack_a2;
  local_78[0].super_Identifier<16U>.m_Value[7] = '\0';
  local_78[0].super_Identifier<16U>.m_Value[8] = '\0';
  local_78[0].super_Identifier<16U>.m_Value[9] = '\0';
  local_78[0].super_Identifier<16U>.m_Value[10] = '\0';
  local_78[0].super_Identifier<16U>.m_Value[0xb] = '\0';
  local_78[0].super_Identifier<16U>.m_Value[0xc] = '\0';
  local_78[0].super_Identifier<16U>.m_Value[0xd] = '\0';
  local_78[0].super_Identifier<16U>.m_Value[0xe] = '\0';
  local_78[0].super_Identifier<16U>.m_Value[0xf] = '\0';
  local_78[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021f038;
  __y = &(this->m_md_lookup)._M_t._M_impl.super__Rb_tree_header;
  cVar3 = std::
          _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
          ::_M_lower_bound((_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
                            *)this,(_Const_Link_type)
                                   (this->m_md_lookup)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent,&__y->_M_header,local_78);
  if ((_Rb_tree_header *)cVar3._M_node == __y) {
    pMVar5 = (MDDEntry *)0x0;
  }
  else {
    pMVar5 = (MDDEntry *)0x0;
    do {
      this_00 = cVar3._M_node + 1;
      bVar2 = UL::MatchExact((UL *)this_00,&local_98);
      if (bVar2) {
        pMVar5 = this->m_MDD_Table + cVar3._M_node[2]._M_color;
        break;
      }
      if (pMVar5 == (MDDEntry *)0x0) {
        bVar2 = UL::MatchIgnoreStream((UL *)this_00,&local_98);
        if ((bVar2) || (bVar2 = UL::MatchIgnorePlaceholder((UL *)this_00,&local_98), bVar2)) {
          pMVar5 = this->m_MDD_Table + cVar3._M_node[2]._M_color;
        }
        else {
          pMVar5 = (MDDEntry *)0x0;
        }
      }
      else {
        bVar2 = UL::MatchIgnoreStream((UL *)this_00,&local_98);
        if (!bVar2) break;
      }
      cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
    } while ((_Rb_tree_header *)cVar3._M_node != __y);
  }
  if (pMVar5 == (MDDEntry *)0x0) {
    this_01 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar4 = UL::EncodeString(&local_98,(char *)local_78,0x40);
    Kumu::ILogSink::Warn(this_01,"UL Dictionary: unknown UL: %s\n",pcVar4);
  }
  return pMVar5;
}

Assistant:

const ASDCP::MDDEntry*
ASDCP::Dictionary::FindULAnyVersion(const byte_t* ul_buf) const
{
  assert(m_MDD_Table[0].name[0]);
  byte_t search_ul[SMPTE_UL_LENGTH];
  memcpy(search_ul, ul_buf, SMPTE_UL_LENGTH);
  memset(search_ul+7, 0, SMPTE_UL_LENGTH-7);

  UL target(ul_buf);
  const ASDCP::MDDEntry *found_entry = 0;

  std::map<UL, ui32_t>::const_iterator lower = m_md_lookup.lower_bound(UL(search_ul));

  for ( ; lower != m_md_lookup.end(); ++lower )
    {
      if ( lower->first.MatchExact(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	  break;
	}
      else if ( found_entry == 0 && lower->first.MatchIgnoreStream(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	}
      else if ( found_entry == 0 && lower->first.MatchIgnorePlaceholder(target) )
	{
	  found_entry = &m_MDD_Table[lower->second];
	}
      else if ( found_entry != 0 && ! lower->first.MatchIgnoreStream(target) )
	{
	  break;
	}
    }

  if ( found_entry == 0 )
    {
      char buf[64];
      Kumu::DefaultLogSink().Warn("UL Dictionary: unknown UL: %s\n", target.EncodeString(buf, 64));
    }

  return found_entry;
}